

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::Clipper::IntersectEdges
          (Clipper *this,TEdge *e1,TEdge *e2,IntPoint *pt,IntersectProtects protects)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  long local_68;
  long64 e2Wc2;
  long64 e1Wc2;
  long64 e2Wc;
  long64 e1Wc;
  PolyFillType local_40;
  PolyFillType e2FillType2;
  PolyFillType e1FillType2;
  PolyFillType e2FillType;
  PolyFillType e1FillType;
  int oldE1WindCnt;
  bool e2contributing;
  bool e1Contributing;
  bool e2stops;
  bool e1stops;
  IntersectProtects protects_local;
  IntPoint *pt_local;
  TEdge *e2_local;
  TEdge *e1_local;
  Clipper *this_local;
  
  bVar3 = false;
  if ((((protects & ipLeft) == ipNone) && (bVar3 = false, e1->nextInLML == (TEdge *)0x0)) &&
     (bVar3 = false, e1->xtop == pt->X)) {
    bVar3 = e1->ytop == pt->Y;
  }
  bVar4 = false;
  if ((((protects & ipRight) == ipNone) && (bVar4 = false, e2->nextInLML == (TEdge *)0x0)) &&
     (bVar4 = false, e2->xtop == pt->X)) {
    bVar4 = e2->ytop == pt->Y;
  }
  bVar5 = e1->outIdx < 0;
  bVar6 = e2->outIdx < 0;
  if (e1->polyType == e2->polyType) {
    bVar2 = IsEvenOddFillType(this,e1);
    if (bVar2) {
      iVar1 = e1->windCnt;
      e1->windCnt = e2->windCnt;
      e2->windCnt = iVar1;
    }
    else {
      if (e1->windCnt + e2->windDelta == 0) {
        e1->windCnt = -e1->windCnt;
      }
      else {
        e1->windCnt = e2->windDelta + e1->windCnt;
      }
      if (e2->windCnt == e1->windDelta) {
        e2->windCnt = -e2->windCnt;
      }
      else {
        e2->windCnt = e2->windCnt - e1->windDelta;
      }
    }
  }
  else {
    bVar2 = IsEvenOddFillType(this,e2);
    if (bVar2) {
      e1->windCnt2 = (uint)(e1->windCnt2 == 0);
    }
    else {
      e1->windCnt2 = e2->windDelta + e1->windCnt2;
    }
    bVar2 = IsEvenOddFillType(this,e1);
    if (bVar2) {
      e2->windCnt2 = (uint)(e2->windCnt2 == 0);
    }
    else {
      e2->windCnt2 = e2->windCnt2 - e1->windDelta;
    }
  }
  if (e1->polyType == ptSubject) {
    e1FillType2 = this->m_SubjFillType;
    local_40 = this->m_ClipFillType;
  }
  else {
    e1FillType2 = this->m_ClipFillType;
    local_40 = this->m_SubjFillType;
  }
  if (e2->polyType == ptSubject) {
    e2FillType2 = this->m_SubjFillType;
    e1Wc._4_4_ = this->m_ClipFillType;
  }
  else {
    e2FillType2 = this->m_ClipFillType;
    e1Wc._4_4_ = this->m_SubjFillType;
  }
  if (e1FillType2 == pftPositive) {
    e2Wc = (long64)e1->windCnt;
  }
  else if (e1FillType2 == pftNegative) {
    e2Wc = (long64)-e1->windCnt;
  }
  else {
    e2Wc = Abs((long)e1->windCnt);
  }
  if (e2FillType2 == pftPositive) {
    e1Wc2 = (long64)e2->windCnt;
  }
  else if (e2FillType2 == pftNegative) {
    e1Wc2 = (long64)-e2->windCnt;
  }
  else {
    e1Wc2 = Abs((long)e2->windCnt);
  }
  if ((bVar5) || (bVar6)) {
    if (bVar5) {
      if (bVar6) {
        if ((((e2Wc == 0) || (e2Wc == 1)) && ((e1Wc2 == 0 || (e1Wc2 == 1)))) &&
           ((bVar3 == false && (bVar4 == false)))) {
          if (local_40 == pftPositive) {
            e2Wc2 = (long64)e1->windCnt2;
          }
          else if (local_40 == pftNegative) {
            e2Wc2 = (long64)-e1->windCnt2;
          }
          else {
            e2Wc2 = Abs((long)e1->windCnt2);
          }
          if (e1Wc._4_4_ == pftPositive) {
            local_68 = (long)e2->windCnt2;
          }
          else if (e1Wc._4_4_ == pftNegative) {
            local_68 = (long)-e2->windCnt2;
          }
          else {
            local_68 = Abs((long)e2->windCnt2);
          }
          if (e1->polyType == e2->polyType) {
            if ((e2Wc == 1) && (e1Wc2 == 1)) {
              switch(this->m_ClipType) {
              case ctIntersection:
                if ((0 < e2Wc2) && (0 < local_68)) {
                  AddLocalMinPoly(this,e1,e2,pt);
                }
                break;
              case ctUnion:
                if ((e2Wc2 < 1) && (local_68 < 1)) {
                  AddLocalMinPoly(this,e1,e2,pt);
                }
                break;
              case ctDifference:
                if ((((e1->polyType == ptClip) && (0 < e2Wc2)) && (0 < local_68)) ||
                   (((e1->polyType == ptSubject && (e2Wc2 < 1)) && (local_68 < 1)))) {
                  AddLocalMinPoly(this,e1,e2,pt);
                }
                break;
              case ctXor:
                AddLocalMinPoly(this,e1,e2,pt);
              }
            }
            else {
              SwapSides(e1,e2);
            }
          }
          else {
            AddLocalMinPoly(this,e1,e2,pt);
          }
        }
      }
      else if (((e2Wc == 0) || (e2Wc == 1)) &&
              ((this->m_ClipType != ctIntersection ||
               ((e1->polyType == ptSubject || (e1->windCnt2 != 0)))))) {
        DoEdge2(this,e1,e2,pt);
      }
    }
    else if (((e1Wc2 == 0) || (e1Wc2 == 1)) &&
            ((this->m_ClipType != ctIntersection ||
             ((e2->polyType == ptSubject || (e2->windCnt2 != 0)))))) {
      DoEdge1(this,e1,e2,pt);
    }
  }
  else if (((((bVar3) || (bVar4)) || ((e2Wc != 0 && (e2Wc != 1)))) || ((e1Wc2 != 0 && (e1Wc2 != 1)))
           ) || ((e1->polyType != e2->polyType && (this->m_ClipType != ctXor)))) {
    AddLocalMaxPoly(this,e1,e2,pt);
  }
  else {
    DoBothEdges(this,e1,e2,pt);
  }
  if ((bVar3 != bVar4) &&
     (((bVar3 != false && (-1 < e1->outIdx)) || ((bVar4 != false && (-1 < e2->outIdx)))))) {
    SwapSides(e1,e2);
    SwapPolyIndexes(e1,e2);
  }
  if (bVar3 != false) {
    DeleteFromAEL(this,e1);
  }
  if (bVar4 != false) {
    DeleteFromAEL(this,e2);
  }
  return;
}

Assistant:

void Clipper::IntersectEdges(TEdge *e1, TEdge *e2,
     const IntPoint &pt, IntersectProtects protects)
{
  //e1 will be to the left of e2 BELOW the intersection. Therefore e1 is before
  //e2 in AEL except when e1 is being inserted at the intersection point ...
  bool e1stops = !(ipLeft & protects) &&  !e1->nextInLML &&
    e1->xtop == pt.X && e1->ytop == pt.Y;
  bool e2stops = !(ipRight & protects) &&  !e2->nextInLML &&
    e2->xtop == pt.X && e2->ytop == pt.Y;
  bool e1Contributing = ( e1->outIdx >= 0 );
  bool e2contributing = ( e2->outIdx >= 0 );

  //update winding counts...
  //assumes that e1 will be to the right of e2 ABOVE the intersection
  if ( e1->polyType == e2->polyType )
  {
    if ( IsEvenOddFillType( *e1) )
    {
      int oldE1WindCnt = e1->windCnt;
      e1->windCnt = e2->windCnt;
      e2->windCnt = oldE1WindCnt;
    } else
    {
      if (e1->windCnt + e2->windDelta == 0 ) e1->windCnt = -e1->windCnt;
      else e1->windCnt += e2->windDelta;
      if ( e2->windCnt - e1->windDelta == 0 ) e2->windCnt = -e2->windCnt;
      else e2->windCnt -= e1->windDelta;
    }
  } else
  {
    if (!IsEvenOddFillType(*e2)) e1->windCnt2 += e2->windDelta;
    else e1->windCnt2 = ( e1->windCnt2 == 0 ) ? 1 : 0;
    if (!IsEvenOddFillType(*e1)) e2->windCnt2 -= e1->windDelta;
    else e2->windCnt2 = ( e2->windCnt2 == 0 ) ? 1 : 0;
  }

  PolyFillType e1FillType, e2FillType, e1FillType2, e2FillType2;
  if (e1->polyType == ptSubject)
  {
    e1FillType = m_SubjFillType;
    e1FillType2 = m_ClipFillType;
  } else
  {
    e1FillType = m_ClipFillType;
    e1FillType2 = m_SubjFillType;
  }
  if (e2->polyType == ptSubject)
  {
    e2FillType = m_SubjFillType;
    e2FillType2 = m_ClipFillType;
  } else
  {
    e2FillType = m_ClipFillType;
    e2FillType2 = m_SubjFillType;
  }

  long64 e1Wc, e2Wc;
  switch (e1FillType)
  {
    case pftPositive: e1Wc = e1->windCnt; break;
    case pftNegative: e1Wc = -e1->windCnt; break;
    default: e1Wc = Abs(e1->windCnt);
  }
  switch(e2FillType)
  {
    case pftPositive: e2Wc = e2->windCnt; break;
    case pftNegative: e2Wc = -e2->windCnt; break;
    default: e2Wc = Abs(e2->windCnt);
  }

  if ( e1Contributing && e2contributing )
  {
    if ( e1stops || e2stops || 
      (e1Wc != 0 && e1Wc != 1) || (e2Wc != 0 && e2Wc != 1) ||
      (e1->polyType != e2->polyType && m_ClipType != ctXor) )
        AddLocalMaxPoly(e1, e2, pt); 
    else
        DoBothEdges( e1, e2, pt );
  }
  else if ( e1Contributing )
  {
    if ((e2Wc == 0 || e2Wc == 1) && 
      (m_ClipType != ctIntersection || 
      e2->polyType == ptSubject || (e2->windCnt2 != 0))) 
        DoEdge1(e1, e2, pt);
  }
  else if ( e2contributing )
  {
    if ((e1Wc == 0 || e1Wc == 1) && 
      (m_ClipType != ctIntersection || 
      e1->polyType == ptSubject || (e1->windCnt2 != 0))) 
        DoEdge2(e1, e2, pt);
  } 
  else if ( (e1Wc == 0 || e1Wc == 1) && 
    (e2Wc == 0 || e2Wc == 1) && !e1stops && !e2stops )
  {
    //neither edge is currently contributing ...

    long64 e1Wc2, e2Wc2;
    switch (e1FillType2)
    {
      case pftPositive: e1Wc2 = e1->windCnt2; break;
      case pftNegative : e1Wc2 = -e1->windCnt2; break;
      default: e1Wc2 = Abs(e1->windCnt2);
    }
    switch (e2FillType2)
    {
      case pftPositive: e2Wc2 = e2->windCnt2; break;
      case pftNegative: e2Wc2 = -e2->windCnt2; break;
      default: e2Wc2 = Abs(e2->windCnt2);
    }

    if (e1->polyType != e2->polyType)
        AddLocalMinPoly(e1, e2, pt);
    else if (e1Wc == 1 && e2Wc == 1)
      switch( m_ClipType ) {
        case ctIntersection:
          if (e1Wc2 > 0 && e2Wc2 > 0)
            AddLocalMinPoly(e1, e2, pt);
          break;
        case ctUnion:
          if ( e1Wc2 <= 0 && e2Wc2 <= 0 )
            AddLocalMinPoly(e1, e2, pt);
          break;
        case ctDifference:
          if (((e1->polyType == ptClip) && (e1Wc2 > 0) && (e2Wc2 > 0)) ||
              ((e1->polyType == ptSubject) && (e1Wc2 <= 0) && (e2Wc2 <= 0)))
                AddLocalMinPoly(e1, e2, pt);
          break;
        case ctXor:
          AddLocalMinPoly(e1, e2, pt);
      }
    else
      SwapSides( *e1, *e2 );
  }

  if(  (e1stops != e2stops) &&
    ( (e1stops && (e1->outIdx >= 0)) || (e2stops && (e2->outIdx >= 0)) ) )
  {
    SwapSides( *e1, *e2 );
    SwapPolyIndexes( *e1, *e2 );
  }

  //finally, delete any non-contributing maxima edges  ...
  if( e1stops ) DeleteFromAEL( e1 );
  if( e2stops ) DeleteFromAEL( e2 );
}